

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

int __thiscall
CVmObjTads::get_prop
          (CVmObjTads *this,vm_prop_id_t prop,vm_val_t *val,vm_obj_id_t self,vm_obj_id_t *source_obj
          ,uint *argc)

{
  int iVar1;
  undefined4 in_ECX;
  vm_obj_id_t *in_RDX;
  undefined2 in_SI;
  vm_val_t *in_RDI;
  uint *in_R8;
  tadsobj_sc_search_ctx *in_R9;
  CVmObject *unaff_retaddr;
  tadsobj_sc_search_ctx curpos;
  CVmObjTads *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  vm_obj_id_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff8;
  undefined2 in_stack_fffffffffffffffc;
  undefined2 uVar2;
  vm_prop_id_t in_stack_fffffffffffffffe;
  undefined2 uVar3;
  
  tadsobj_sc_search_ctx::tadsobj_sc_search_ctx
            ((tadsobj_sc_search_ctx *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
  iVar1 = tadsobj_sc_search_ctx::find_prop
                    (in_R9,in_stack_ffffffffffffffc4,
                     (vm_val_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (vm_obj_id_t *)in_stack_ffffffffffffffb0);
  if (iVar1 == 0) {
    iVar1 = get_prop_intrinsic((CVmObjTads *)
                               CONCAT26(in_stack_fffffffffffffffe,
                                        CONCAT24(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8
                                                )),(vm_prop_id_t)((ulong)in_RDI >> 0x30),
                               (vm_val_t *)
                               CONCAT26(in_SI,CONCAT24(in_stack_ffffffffffffffec,
                                                       in_stack_ffffffffffffffe8)),
                               (vm_obj_id_t)((ulong)in_RDX >> 0x20),
                               (vm_obj_id_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),in_R8);
    if (iVar1 == 0) {
      iVar1 = CVmObject::get_prop(unaff_retaddr,in_stack_fffffffffffffffe,in_RDI,
                                  CONCAT22(in_SI,in_stack_ffffffffffffffec),in_RDX,
                                  (uint *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
      uVar2 = (undefined2)iVar1;
      uVar3 = (undefined2)((uint)iVar1 >> 0x10);
    }
    else {
      uVar2 = 1;
      uVar3 = 0;
    }
  }
  else {
    uVar2 = 1;
    uVar3 = 0;
  }
  return CONCAT22(uVar3,uVar2);
}

Assistant:

int CVmObjTads::get_prop(VMG_ vm_prop_id_t prop, vm_val_t *val,
                         vm_obj_id_t self, vm_obj_id_t *source_obj,
                         uint *argc)
{
    /* 
     *   try finding the property in my own direct property list or a
     *   superclass property list 
     */
    tadsobj_sc_search_ctx curpos(vmg_ self, this);
    if (curpos.find_prop(vmg_ prop, val, source_obj))
        return TRUE;

    /* 
     *   we didn't find the property in a property list, so try the
     *   intrinsic class methods
     */
    if (get_prop_intrinsic(vmg_ prop, val, self, source_obj, argc))
        return TRUE;

    /* 
     *   we didn't find the property among our methods, so try inheriting it
     *   from the base metaclass 
     */
    return CVmObject::get_prop(vmg_ prop, val, self, source_obj, argc);
}